

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

bool __thiscall glslang::HlslParseContext::wasFlattened(HlslParseContext *this,TIntermTyped *node)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  longlong id;
  bool local_19;
  TIntermTyped *node_local;
  HlslParseContext *this_local;
  
  local_19 = false;
  if (node != (TIntermTyped *)0x0) {
    iVar1 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x18])();
    local_19 = false;
    if (CONCAT44(extraout_var,iVar1) != 0) {
      iVar1 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x18])();
      id = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x180))();
      local_19 = wasFlattened(this,id);
    }
  }
  return local_19;
}

Assistant:

bool HlslParseContext::wasFlattened(const TIntermTyped* node) const
{
    return node != nullptr && node->getAsSymbolNode() != nullptr &&
           wasFlattened(node->getAsSymbolNode()->getId());
}